

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1ddac71::AV1LbdInvTxfm2d_DISABLED_Speed_Test::TestBody
          (AV1LbdInvTxfm2d_DISABLED_Speed_Test *this)

{
  int iVar1;
  long lVar2;
  int j;
  ulong uVar3;
  
  uVar3 = 1;
  do {
    iVar1 = (uint)((0x18608UL >> (uVar3 & 0x3f) & 1) == 0) * 4 + 1;
    if ((0x61810UL >> (uVar3 & 0x3f) & 1) != 0) {
      iVar1 = 0;
    }
    lVar2 = 0;
    do {
      if (*(int *)((long)av1_ext_tx_used[0] + (ulong)(uint)(iVar1 << 6) + lVar2 * 4) != 0) {
        AV1LbdInvTxfm2d::RunAV1InvTxfm2dTest
                  (&this->super_AV1LbdInvTxfm2d,(TxType)lVar2,(TxSize)uVar3,10000000,0);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 0x13);
  return;
}

Assistant:

TEST_P(AV1LbdInvTxfm2d, DISABLED_Speed) {
  for (int j = 1; j < (int)(TX_SIZES_ALL); ++j) {
    for (int i = 0; i < (int)TX_TYPES; ++i) {
      if (libaom_test::IsTxSizeTypeValid(static_cast<TxSize>(j),
                                         static_cast<TxType>(i))) {
        RunAV1InvTxfm2dTest(static_cast<TxType>(i), static_cast<TxSize>(j),
                            10000000);
      }
    }
  }
}